

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O1

void __thiscall TernaryReturned::TernaryReturned(TernaryReturned *this,Exception e)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  Item::Item(&this->item,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this->exception = e;
  return;
}

Assistant:

TernaryReturned(Exception e) : item(Item("")), exception(e) {}